

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O3

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  pointer pMVar5;
  long lVar6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  double dVar9;
  Index size;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar10;
  pointer pMVar11;
  long *in_RCX;
  ulong uVar12;
  _func_int **pp_Var13;
  char *__function;
  long lVar14;
  DenseIndex extraout_RDX;
  DenseIndex extraout_RDX_00;
  DenseIndex DVar15;
  DenseIndex extraout_RDX_01;
  ulong uVar16;
  Index size_2;
  Index index_2;
  _func_int *p_Var17;
  undefined1 auVar18 [16];
  undefined1 extraout_XMM0 [16];
  VectorXd VVar19;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  tmp;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  void *local_50;
  ulong local_48;
  Scalar local_40;
  Scalar local_38;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,4,4,1);
  local_78.m_row = 0;
  local_78.m_col = 1;
  local_78.m_currentBlockRows = 1;
  *this->_vptr_Tools = (_func_int *)0x0;
  local_50 = (void *)0x0;
  local_78.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_78,(Scalar *)&local_50);
  local_40 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (pCVar10,&local_40);
  local_38 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar10,&local_38);
  if ((local_78.m_row + local_78.m_currentBlockRows !=
       ((local_78.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
       m_rows) || (local_78.m_col != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/CommaInitializer.h"
                  ,0x6f,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pMVar11 = (ground_truth->
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (ground_truth->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((pMVar5 != pMVar11) && ((long)pMVar5 - (long)pMVar11 == in_RCX[1] - *in_RCX)) {
    uVar16 = 0;
    do {
      local_78.m_xpr = pMVar11 + uVar16;
      local_78.m_row = *in_RCX + uVar16 * 0x10;
      if (pMVar11[uVar16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows != *(long *)(*in_RCX + 8 + uVar16 * 0x10)) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x84,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_50,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_78);
      local_78.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)&local_50;
      local_78.m_row = (Index)&local_50;
      if ((long)local_48 < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/PlainObjectBase.h"
                      ,0xf1,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_50,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_78);
      if (local_48 != *(ulong *)(local_78.m_row + 8)) {
        __function = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>]"
        ;
        goto LAB_0010ff7a;
      }
      uVar12 = local_48 - ((long)local_48 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)local_48) {
        lVar14 = 0;
        do {
          pdVar1 = (double *)(*(long *)local_78.m_xpr + lVar14 * 8);
          dVar4 = pdVar1[1];
          pdVar2 = (double *)(*(long *)local_78.m_row + lVar14 * 8);
          dVar9 = pdVar2[1];
          pdVar3 = (double *)((long)local_50 + lVar14 * 8);
          *pdVar3 = *pdVar1 * *pdVar2;
          pdVar3[1] = dVar4 * dVar9;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)uVar12);
      }
      if ((long)uVar12 < (long)local_48) {
        lVar14 = *(long *)local_78.m_xpr;
        lVar6 = *(long *)local_78.m_row;
        do {
          *(double *)((long)local_50 + uVar12 * 8) =
               *(double *)(lVar14 + uVar12 * 8) * *(double *)(lVar6 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (local_48 != uVar12);
      }
      local_78.m_row = (Index)&local_40;
      local_78.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
      Eigen::
      SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&local_78,(Matrix<double,__1,_1,_0,__1,_1> *)&local_50);
      free(local_50);
      uVar16 = (ulong)((int)uVar16 + 1);
      pMVar11 = (ground_truth->
                super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(ground_truth->
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 4;
    } while (uVar16 < uVar12);
    local_78.m_row = (Index)(double)(long)uVar12;
    local_78.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    resizeLike<Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_78);
    pp_Var7 = this[1]._vptr_Tools;
    if (pp_Var7 == *(_func_int ***)((long)local_78.m_xpr + 8)) {
      pp_Var13 = (_func_int **)((long)pp_Var7 - ((long)pp_Var7 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)pp_Var7) {
        lVar14 = 0;
        do {
          auVar18._8_8_ = local_78.m_row;
          auVar18._0_8_ = local_78.m_row;
          auVar18 = divpd(*(undefined1 (*) [16])(*(long *)local_78.m_xpr + lVar14 * 8),auVar18);
          *(undefined1 (*) [16])(this->_vptr_Tools + lVar14) = auVar18;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)pp_Var13);
      }
      if ((long)pp_Var13 < (long)pp_Var7) {
        lVar14 = *(long *)local_78.m_xpr;
        pp_Var8 = this->_vptr_Tools;
        do {
          pp_Var8[(long)pp_Var13] =
               (_func_int *)(*(double *)(lVar14 + (long)pp_Var13 * 8) / (double)local_78.m_row);
          pp_Var13 = (_func_int **)((long)pp_Var13 + 1);
        } while (pp_Var7 != pp_Var13);
      }
      local_78.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                 (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_78);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                 (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_78);
      pp_Var7 = this[1]._vptr_Tools;
      if (pp_Var7 == *(_func_int ***)((long)local_78.m_xpr + 8)) {
        pp_Var13 = (_func_int **)((long)pp_Var7 - ((long)pp_Var7 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)pp_Var7) {
          lVar14 = 0;
          auVar18 = extraout_XMM0;
          do {
            auVar18 = sqrtpd(auVar18,*(undefined1 (*) [16])(*(long *)local_78.m_xpr + lVar14 * 8));
            *(undefined1 (*) [16])(this->_vptr_Tools + lVar14) = auVar18;
            lVar14 = lVar14 + 2;
          } while (lVar14 < (long)pp_Var13);
        }
        DVar15 = extraout_RDX;
        if ((long)pp_Var13 < (long)pp_Var7) {
          do {
            dVar4 = *(double *)(*(long *)local_78.m_xpr + (long)pp_Var13 * 8);
            if (dVar4 < 0.0) {
              p_Var17 = (_func_int *)sqrt(dVar4);
              DVar15 = extraout_RDX_00;
            }
            else {
              p_Var17 = (_func_int *)SQRT(dVar4);
            }
            this->_vptr_Tools[(long)pp_Var13] = p_Var17;
            pp_Var13 = (_func_int **)((long)pp_Var13 + 1);
          } while (pp_Var7 != pp_Var13);
        }
        goto LAB_0010ff53;
      }
      __function = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>]"
      ;
    }
    else {
      __function = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>, const Eigen::Matrix<double, -1, 1>>]"
      ;
    }
LAB_0010ff7a:
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,__function);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Invalid estimation or ground_truth data",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  DVar15 = extraout_RDX_01;
LAB_0010ff53:
  VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar15;
  VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
	/*
  Calculate RMSE
  */
	
  VectorXd rmse(4);
	rmse << 0, 0, 0, 0;

	// Make sure estimation vector size is not zero and,
	// the estimation vector size is equal to the ground truth vector size
  if (estimations.size() != ground_truth.size()
    || estimations.size() == 0){
    std::cout << "Invalid estimation or ground_truth data" << std::endl;
    return rmse;
  }
	
		//accumulate squared residuals
	for(unsigned int i=0; i < estimations.size(); ++i){

		VectorXd residual = estimations[i] - ground_truth[i];

		//coefficient-wise multiplication
		residual = residual.array()*residual.array();
		rmse += residual;
	}

	//calculate the mean
	rmse = rmse/estimations.size();

	//calculate the squared root
	rmse = rmse.array().sqrt();

	//return the result
	return rmse;
	}